

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptrlen.c
# Opt level: O2

_Bool ptrlen_contains_only(ptrlen input,char *characters)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  
  pcVar3 = (char *)((long)input.ptr + input.len);
  pcVar1 = (char *)input.ptr;
  do {
    pcVar4 = pcVar1;
    if (pcVar3 <= pcVar4) break;
    pcVar2 = strchr(characters,(int)*pcVar4);
    pcVar1 = pcVar4 + 1;
  } while (pcVar2 != (char *)0x0);
  return pcVar3 <= pcVar4;
}

Assistant:

bool ptrlen_contains_only(ptrlen input, const char *characters)
{
    for (const char *p = input.ptr, *end = p + input.len; p < end; p++)
        if (!strchr(characters, *p))
            return false;
    return true;
}